

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

Sol * exampleB(Sol *__return_storage_ptr__,vector<ride,_std::allocator<ride>_> *rides,long vehs,
              long STEPS)

{
  vector<ride,std::allocator<ride>> *this;
  pointer prVar1;
  iterator __position;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ride *__args;
  long lVar6;
  long *plVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  veh v;
  priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> vehicles;
  vector<bool,_std::allocator<bool>_> used;
  long local_b0;
  value_type local_a8;
  priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> local_88;
  long local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,
             (long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 6,(bool *)&local_88,
             (allocator_type *)&local_a8);
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::vector(__return_storage_ptr__,vehs,(allocator_type *)&local_88);
  local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (0 < vehs) {
    lVar12 = 0;
    do {
      local_a8.avail_time = 0;
      local_a8.loc.x = 0;
      local_a8.loc.y = 0;
      local_a8.id = lVar12;
      std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::push
                (&local_88,&local_a8);
      lVar12 = lVar12 + 1;
    } while (vehs != lVar12);
  }
  if ((rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar4 = 0;
    local_60 = STEPS;
    do {
      local_a8.id = (local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                     super__Vector_impl_data._M_start)->id;
      local_a8.avail_time =
           (local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data
           ._M_start)->avail_time;
      local_a8.loc.x =
           ((local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
             super__Vector_impl_data._M_start)->loc).x;
      local_a8.loc.y =
           ((local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
             super__Vector_impl_data._M_start)->loc).y;
      std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::pop
                (&local_88);
      iVar5 = 5;
      if (local_a8.avail_time < STEPS) {
        prVar1 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar12 = (long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)prVar1;
        if (lVar12 == 0) {
          uVar11 = 0xffffffffffffffff;
          local_b0 = 0;
        }
        else {
          lVar12 = lVar12 >> 6;
          plVar7 = &(prVar1->start).y;
          uVar11 = 0xffffffffffffffff;
          uVar8 = 0;
          local_b0 = 0;
          lVar13 = 0x7fffffffffffffff;
          do {
            if (((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar8 >> 6] >>
                  (uVar8 & 0x3f) & 1) == 0) && (local_a8.avail_time <= plVar7[-3])) {
              lVar9 = local_a8.loc.x - ((pt *)(plVar7 + -1))->x;
              lVar10 = -lVar9;
              if (0 < lVar9) {
                lVar10 = lVar9;
              }
              lVar6 = local_a8.loc.y - *plVar7;
              lVar9 = -lVar6;
              if (0 < lVar6) {
                lVar9 = lVar6;
              }
              lVar9 = lVar9 + lVar10;
              lVar6 = plVar7[-2] + local_a8.avail_time + lVar9;
              lVar10 = plVar7[-2] + plVar7[-4];
              if (lVar10 < lVar6) {
                lVar10 = lVar6;
              }
              if (lVar10 <= plVar7[-3] && lVar9 < lVar13) {
                uVar11 = uVar8;
                lVar13 = lVar9;
                local_b0 = lVar10;
              }
            }
            uVar8 = uVar8 + 1;
            plVar7 = plVar7 + 8;
          } while (lVar12 + (ulong)(lVar12 == 0) != uVar8);
        }
        STEPS = local_60;
        if ((long)uVar11 < 0) {
          iVar5 = 7;
        }
        else {
          __args = prVar1 + uVar11;
          this = (vector<ride,std::allocator<ride>> *)
                 ((__return_storage_ptr__->
                  super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + local_a8.id);
          __position._M_current = *(ride **)(this + 8);
          if (__position._M_current == *(ride **)(this + 0x10)) {
            std::vector<ride,std::allocator<ride>>::_M_realloc_insert<ride_const&>
                      (this,__position,__args);
          }
          else {
            lVar12 = __args->id;
            lVar13 = __args->s_time;
            lVar10 = __args->e_time;
            lVar9 = __args->len;
            lVar6 = (__args->start).x;
            lVar2 = (__args->start).y;
            lVar3 = (__args->end).y;
            ((__position._M_current)->end).x = (__args->end).x;
            ((__position._M_current)->end).y = lVar3;
            ((__position._M_current)->start).x = lVar6;
            ((__position._M_current)->start).y = lVar2;
            (__position._M_current)->e_time = lVar10;
            (__position._M_current)->len = lVar9;
            (__position._M_current)->id = lVar12;
            (__position._M_current)->s_time = lVar13;
            *(long *)(this + 8) = *(long *)(this + 8) + 0x40;
          }
          local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar11 >> 6] =
               local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar11 >> 6] | 1L << ((byte)uVar11 & 0x3f);
          local_a8.avail_time = local_b0;
          if (__args->e_time < local_b0) {
            __assert_fail("min_end <= chosen.e_time",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/oskopek[P]ghc18/main.cpp"
                          ,0x89,"Sol exampleB(const vector<ride> &, const long, const long)");
          }
          local_a8.loc.x = (__args->end).x;
          local_a8.loc.y = (__args->end).y;
          iVar5 = 0;
          std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::push
                    (&local_88,&local_a8);
        }
      }
    } while (((iVar5 == 7) || (iVar5 == 0)) &&
            (uVar4 = uVar4 + 1,
            uVar4 < (ulong)((long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                                  super__Vector_impl_data._M_start >> 6)));
  }
  if (local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Sol exampleB(const vector<ride>& rides, const long vehs, const long STEPS) {
    vector<bool> used(rides.size(), false);
    Sol sol(vehs);
    priority_queue<veh> vehicles;
    for (long i = 0; i < vehs; i++) {
        vehicles.push(veh{i, 0, pt{0, 0}});
    }

    for (long used_rides = 0; used_rides < rides.size(); used_rides++) {
        veh v = vehicles.top(); vehicles.pop();
        if (v.avail_time >= STEPS) break;

        // Find closest ride
        long min_closeness = LONG_MAX;
        long min_idx = -1;
        long min_end = 0;
        for (long i = 0; i < rides.size(); i++) {
            const ride& r = rides[i];
            if (used[i]) continue;
            if (r.e_time < v.avail_time) continue;
            const long closeness = dist(v.loc, r.start);
            const long end_time = max(v.avail_time + closeness + r.len, r.s_time + r.len); // max(no-wait, wait)
            if (closeness < min_closeness && end_time <= r.e_time) {
                min_closeness = closeness;
                min_idx = i;
                min_end = end_time;
            }
        }

        if (min_idx < 0) {
            continue; // leave out this car, cannot use it again
        }
        // Update sol
        const ride& chosen = rides[min_idx];
        sol[v.id].push_back(chosen);
        used[min_idx] = true;

        // Update vehicle
        v.avail_time = min_end;
        assert(min_end <= chosen.e_time);
        v.loc = chosen.end;
        vehicles.push(v);
    }

    return sol;
}